

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.hpp
# Opt level: O2

string * __thiscall
Kandinsky::VariableExpression::toString_abi_cxx11_
          (string *__return_storage_ptr__,VariableExpression *this,bool evaluate)

{
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,evaluate) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_name);
  }
  else {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
    ::operator()(__return_storage_ptr__,&this->m_formatter,this->m_value);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString(bool evaluate = false) const
        {
            return evaluate ? m_formatter(m_value) : m_name;
        }